

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Array *ast)

{
  bool bVar1;
  long in_RSI;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  *in_RDI;
  Element *element;
  iterator __end2;
  iterator __begin2;
  Elements *__range2;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
  local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 0x80;
  local_10 = in_RSI;
  local_20._M_current =
       (Element *)
       std::
       vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
       ::begin(in_RDI);
  std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
         ::operator*(&local_20);
    (*(code *)*(pointer *)
               ((long)&(in_RDI->
                       super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].commaFodder.
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       ._M_impl + 8))(in_RDI,in_stack_ffffffffffffffd0);
    (**(code **)&(((in_RDI->
                   super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   )._M_impl.super__Vector_impl_data._M_start)->commaFodder).
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data)(in_RDI,&in_stack_ffffffffffffffd0->commaFodder);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
    ::operator++(&local_20);
  }
  (**(code **)&(((in_RDI->
                 super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                 )._M_impl.super__Vector_impl_data._M_start)->commaFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data)(in_RDI,local_10 + 0xa0);
  return;
}

Assistant:

void CompilerPass::visit(Array *ast)
{
    for (auto &element : ast->elements) {
        expr(element.expr);
        fodder(element.commaFodder);
    }
    fodder(ast->closeFodder);
}